

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Matrix.c
# Opt level: O0

void Llb_MtrVerifyRowsAll(Llb_Mtr_t *p)

{
  int local_1c;
  int local_18;
  int Counter;
  int iCol;
  int iRow;
  Llb_Mtr_t *p_local;
  
  local_18 = 0;
  while( true ) {
    if (p->nCols <= local_18) {
      return;
    }
    local_1c = 0;
    for (Counter = 0; Counter < p->nRows; Counter = Counter + 1) {
      if (p->pMatrix[local_18][Counter] == '\x01') {
        local_1c = local_1c + 1;
      }
    }
    if (local_1c != p->pColSums[local_18]) break;
    local_18 = local_18 + 1;
  }
  __assert_fail("Counter == p->pColSums[iCol]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Matrix.c"
                ,0x4c,"void Llb_MtrVerifyRowsAll(Llb_Mtr_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

//              0123              nCols
//             +--------------------->  
// pi        0 |  111             row0   pRowSums[0]  
// pi        1 | 1     11         row1   pRowSums[1] 
// pi        2 |   1  11          row2   pRowSums[2] 
// CS          |1       1
// CS          |1      111
// CS          |111    111
// int         |  11111           
// int         |     111          
// int         |       111        
// int         |         111      
// NS          |           11 11
// NS          |            11 1
// NS          |             111
//       nRows |
//             v    
//              cccc   pColSums[0]
//              oooo   pColSums[1]
//              llll   pColSums[2]
//              0123   pColSums[3]

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Verify columns.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Llb_MtrVerifyRowsAll( Llb_Mtr_t * p )
{
    int iRow, iCol, Counter;
    for ( iCol = 0; iCol < p->nCols; iCol++ )
    {
        Counter = 0;
        for ( iRow = 0; iRow < p->nRows; iRow++ )
            if ( p->pMatrix[iCol][iRow] == 1 )
                Counter++;
        assert( Counter == p->pColSums[iCol] );
    }
}